

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall
pbrt::syntactic::LightSource::LightSource
          (LightSource *this,string *type,Transform *transform,SP *attributes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  Transform *pTVar3;
  byte bVar4;
  
  bVar4 = 0;
  Node::Node(&this->super_Node,type);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__00179d48;
  pTVar3 = &this->transform;
  for (lVar2 = 0x18; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pTVar3->atStart).l.vx.x = (transform->atStart).l.vx.x;
    transform = (Transform *)((long)transform + (ulong)bVar4 * -8 + 4);
    pTVar3 = (Transform *)((long)pTVar3 + (ulong)bVar4 * -8 + 4);
  }
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (attributes->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  p_Var1 = (attributes->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

LightSource(const std::string &type, 
                  const Transform &transform,
                  Attributes::SP  attributes)
        : Node(type),
          transform(transform),
          attributes(attributes)
      {}